

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

ReadFileResult __thiscall
cmCMakePresetsGraph::ReadJSONFile
          (cmCMakePresetsGraph *this,string *filename,RootType rootType,ReadReason readReason,
          vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
          *inProgressFiles,File **file,string *errMsg)

{
  pointer puVar1;
  File *pFVar2;
  pointer pcVar3;
  pointer pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  ReadFileResult RVar9;
  uint uVar10;
  uint uVar11;
  ReadFileResult RVar12;
  __normal_iterator<cmCMakePresetsGraph::File_**,_std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>_>
  _Var13;
  vector<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  *this_00;
  Value *value;
  unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_> *f;
  pointer puVar14;
  File **__args;
  pointer pbVar15;
  TestPreset *pTVar16;
  PackagePreset *pPVar17;
  string *psVar18;
  ReadFileResult unaff_R13D;
  byte bVar19;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_bool>
  pVar20;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_bool>
  pVar21;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_bool>
  pVar22;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>,_bool>
  pVar23;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>,_bool>
  pVar24;
  __single_object filePtr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> include;
  string directory;
  Value root;
  anon_class_24_3_d2e26b0a includeFile;
  RootPresets presets;
  __node_gen_type __node_gen;
  CharReaderBuilder builder;
  PresetPair<cmCMakePresetsGraph::ConfigurePreset> presetPair;
  ifstream fin;
  int local_f0c;
  TestPreset *local_f08;
  File **local_f00;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
  *local_ef8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_ef0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_ee8;
  PackagePreset *local_ee0;
  cmCMakePresetsGraph *local_ed8;
  _Head_base<0UL,_cmCMakePresetsGraph::File_*,_false> local_ed0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_ec8;
  RootType local_ebc;
  pointer local_eb8;
  ReadReason local_eac;
  string local_ea8;
  string local_e88;
  undefined1 local_e68 [80];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e18;
  undefined8 local_e08;
  uint local_e00;
  TestPreset *local_df8;
  TestPreset *local_df0;
  TestPreset *local_de0;
  TestPreset *local_dd8;
  TestPreset *local_dc8;
  TestPreset *local_dc0;
  PackagePreset *local_db0;
  PackagePreset *local_da8;
  PackagePreset *local_d98;
  PackagePreset *local_d90;
  pointer local_d80;
  pointer local_d78;
  undefined1 local_d68 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d50;
  _Alloc_hider local_d40;
  undefined1 uStack_d38;
  undefined7 uStack_d37;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d30;
  _Alloc_hider local_d18;
  pointer local_d10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d08;
  _Alloc_hider local_cf8;
  size_type local_cf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ce8;
  _Alloc_hider local_cd8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_cd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_ca8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_ca0;
  size_t local_c98;
  undefined1 local_c90 [16];
  undefined1 local_c80 [32];
  undefined1 auStack_c60 [8];
  undefined1 auStack_c58 [32];
  undefined1 local_c38 [8];
  undefined1 local_c30 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c18;
  undefined4 local_c08;
  undefined1 uStack_c04;
  undefined3 uStack_c03;
  undefined1 local_c00 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bd0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ba0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b70;
  undefined1 local_b60 [1288];
  bool local_658;
  CharReaderBuilder local_650;
  undefined1 local_620 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  pointer pbStack_5f8;
  undefined1 uStack_5f0;
  undefined7 local_5ef;
  undefined1 uStack_5e8;
  undefined8 uStack_5e7;
  _Alloc_hider local_5d0;
  size_type local_5c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c0;
  _Alloc_hider local_5b0;
  size_type local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  element_type *local_590;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_588;
  bool local_580;
  _Rb_tree_node_base local_570;
  size_t local_550;
  _Alloc_hider local_548;
  size_type local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  _Alloc_hider local_528;
  size_type local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  bool local_504;
  _Alloc_hider local_500;
  size_type local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  bool local_4dc;
  _Alloc_hider local_4d8;
  size_type local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  _Alloc_hider local_4b8;
  size_type local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  _Alloc_hider local_498;
  size_type local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  _Rb_tree_node_base local_470;
  size_t local_450;
  bool local_447;
  bool local_445;
  bool local_443;
  bool local_441;
  bool local_43f;
  bool local_43d;
  bool local_43b;
  bool local_439;
  bool local_437;
  bool local_435;
  ConfigurePreset local_430;
  bool local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  puVar1 = (this->Files).
           super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_ed8 = this;
  local_ebc = rootType;
  local_eac = readReason;
  local_eb8 = (pointer)inProgressFiles;
  local_f00 = file;
  for (puVar14 = (this->Files).
                 super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; bVar8 = puVar14 != puVar1, bVar8;
      puVar14 = puVar14 + 1) {
    bVar7 = cmsys::SystemTools::SameFile
                      (filename,&((puVar14->_M_t).
                                  super___uniq_ptr_impl<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCMakePresetsGraph::File_*,_std::default_delete<cmCMakePresetsGraph::File>_>
                                  .super__Head_base<0UL,_cmCMakePresetsGraph::File_*,_false>.
                                 _M_head_impl)->Filename);
    pBVar4 = local_eb8;
    if (bVar7) {
      *local_f00 = (puVar14->_M_t).
                   super___uniq_ptr_impl<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCMakePresetsGraph::File_*,_std::default_delete<cmCMakePresetsGraph::File>_>
                   .super__Head_base<0UL,_cmCMakePresetsGraph::File_*,_false>._M_head_impl;
      _Var13 = std::
               __find_if<__gnu_cxx::__normal_iterator<cmCMakePresetsGraph::File**,std::vector<cmCMakePresetsGraph::File*,std::allocator<cmCMakePresetsGraph::File*>>>,__gnu_cxx::__ops::_Iter_equals_val<cmCMakePresetsGraph::File*const>>
                         ((((_Vector_impl *)&(local_eb8->super_Preset)._vptr_Preset)->
                          super__Vector_impl_data)._M_start,
                          (local_eb8->super_Preset).Name._M_dataplus._M_p);
      unaff_R13D = CYCLIC_INCLUDE;
      if (_Var13._M_current == (File **)(pBVar4->super_Preset).Name._M_dataplus._M_p) {
        unaff_R13D = READ_OK;
      }
    }
    if (bVar7) break;
  }
  if (bVar8) {
    return unaff_R13D;
  }
  std::ifstream::ifstream(local_238,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    local_d68._8_8_ = (filename->_M_dataplus)._M_p;
    local_d68._0_8_ = filename->_M_string_length;
    local_d68._16_8_ = 0x16;
    local_d50._0_8_ = ": Failed to read file\n";
    local_d40._M_p = (errMsg->_M_dataplus)._M_p;
    local_d50._8_8_ = errMsg->_M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)local_d68;
    cmCatViews_abi_cxx11_((string *)local_620,views);
    std::__cxx11::string::operator=((string *)errMsg,(string *)local_620);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_620._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_620 + 0x10)) {
      operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
    }
    RVar9 = FILE_NOT_FOUND;
    goto LAB_00230483;
  }
  cmsys::FStream::ReadBOM((istream *)local_238);
  Json::Value::Value((Value *)local_e68,nullValue);
  __args = local_f00;
  Json::CharReaderBuilder::CharReaderBuilder(&local_650);
  Json::CharReaderBuilder::strictMode(&local_650.settings_);
  bVar8 = Json::parseFromStream
                    (&local_650.super_Factory,(IStream *)local_238,(Value *)local_e68,errMsg);
  if (bVar8) {
    local_f0c = 0;
    RVar9 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<int>::operator()
                      ((Object<int> *)(anonymous_namespace)::RootVersionHelper,&local_f0c,
                       (Value *)local_e68);
    if ((RVar9 == READ_OK) && (RVar9 = UNRECOGNIZED_VERSION, 0xfffffff9 < local_f0c - 7U)) {
      if (local_f0c < 2) {
        bVar8 = Json::Value::isMember((Value *)local_e68,"buildPresets");
        RVar9 = BUILD_TEST_PRESETS_UNSUPPORTED;
        if ((bVar8) || (bVar8 = Json::Value::isMember((Value *)local_e68,"testPresets"), bVar8))
        goto LAB_00230469;
      }
      if (local_f0c < 6) {
        bVar8 = Json::Value::isMember((Value *)local_e68,"packagePresets");
        RVar9 = PACKAGE_PRESETS_UNSUPPORTED;
        if (bVar8) goto LAB_00230469;
      }
      if (local_f0c < 6) {
        bVar8 = Json::Value::isMember((Value *)local_e68,"workflowPresets");
        RVar9 = WORKFLOW_PRESETS_UNSUPPORTED;
        if (bVar8) goto LAB_00230469;
      }
      if (local_f0c < 4) {
        bVar8 = Json::Value::isMember((Value *)local_e68,"include");
        RVar9 = INCLUDE_UNSUPPORTED;
        if (bVar8) goto LAB_00230469;
      }
      local_e08 = (pointer)0x0;
      local_e00 = 0;
      memset(&local_df8,0,0x90);
      RVar9 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
              Object<(anonymous_namespace)::RootPresets>::operator()
                        ((Object<(anonymous_namespace)::RootPresets> *)&local_e08,
                         (RootPresets *)local_e68,value);
      if (RVar9 == READ_OK) {
        uVar10 = cmVersion::GetMajorVersion();
        uVar11 = cmVersion::GetMinorVersion();
        local_f08 = (TestPreset *)CONCAT44(local_f08._4_4_,uVar11);
        uVar11 = cmVersion::GetPatchVersion();
        this_00 = &local_ed8->Files;
        RVar9 = UNRECOGNIZED_CMAKE_VERSION;
        if ((uint)local_e08 <= uVar10) {
          if ((uint)local_e08 == uVar10) {
            if (((uint)local_f08 < local_e08._4_4_) ||
               ((local_e08._4_4_ == (uint)local_f08 && (uVar11 < local_e00)))) goto LAB_0023119a;
          }
          std::make_unique<cmCMakePresetsGraph::File>();
          *__args = local_ed0._M_head_impl;
          std::
          vector<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>>>
          ::
          emplace_back<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>>
                    ((vector<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>,std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,std::default_delete<cmCMakePresetsGraph::File>>>>
                      *)this_00,
                     (unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>
                      *)&local_ed0);
          std::vector<cmCMakePresetsGraph::File*,std::allocator<cmCMakePresetsGraph::File*>>::
          emplace_back<cmCMakePresetsGraph::File*&>
                    ((vector<cmCMakePresetsGraph::File*,std::allocator<cmCMakePresetsGraph::File*>>
                      *)local_eb8,__args);
          std::__cxx11::string::_M_assign((string *)*__args);
          pFVar2 = *__args;
          pFVar2->Version = local_f0c;
          local_d68._0_8_ = &pFVar2->ReachableFiles;
          std::
          _Hashtable<cmCMakePresetsGraph::File*,cmCMakePresetsGraph::File*,std::allocator<cmCMakePresetsGraph::File*>,std::__detail::_Identity,std::equal_to<cmCMakePresetsGraph::File*>,std::hash<cmCMakePresetsGraph::File*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<cmCMakePresetsGraph::File*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<cmCMakePresetsGraph::File*,false>>>>
                    ((_Hashtable<cmCMakePresetsGraph::File*,cmCMakePresetsGraph::File*,std::allocator<cmCMakePresetsGraph::File*>,std::__detail::_Identity,std::equal_to<cmCMakePresetsGraph::File*>,std::hash<cmCMakePresetsGraph::File*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_d68._0_8_,__args);
          local_f08 = local_df0;
          bVar19 = local_df8 == local_df0;
          RVar9 = unaff_R13D;
          if (!(bool)bVar19) {
            local_ef8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                         *)&local_ed8->ConfigurePresets;
            local_ec8 = &local_ed8->ConfigurePresetOrder;
            local_ef0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&PTR__ConfigurePreset_009615c8;
            pTVar16 = local_df8;
            do {
              (pTVar16->super_Preset).OriginFile = *__args;
              local_ee0 = (PackagePreset *)CONCAT71(local_ee0._1_7_,bVar19);
              if ((pTVar16->super_Preset).Name._M_string_length == 0) {
                std::__cxx11::string::append((char *)errMsg);
                std::__cxx11::string::_M_append((char *)errMsg,(ulong)(filename->_M_dataplus)._M_p);
                RVar9 = INVALID_PRESET;
                bVar8 = false;
              }
              else {
                local_620._8_8_ = &local_608;
                local_620._16_8_ = 0;
                local_608._M_local_buf[0] = '\0';
                uStack_5e8 = 0;
                uStack_5e7 = 0;
                pbStack_5f8 = (pointer)0x0;
                uStack_5f0 = 0;
                local_5ef = 0;
                local_5d0._M_p = (pointer)&local_5c0;
                local_5c8 = 0;
                local_5c0._M_local_buf[0] = '\0';
                local_5b0._M_p = (pointer)&local_5a0;
                local_5a8 = 0;
                local_5a0._M_local_buf[0] = '\0';
                local_590 = (element_type *)0x0;
                _Stack_588._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_580 = true;
                local_570._M_color = _S_red;
                local_570._M_parent = (_Base_ptr)0x0;
                local_570._M_left = &local_570;
                local_550 = 0;
                local_620._0_8_ = local_ef0;
                local_548._M_p = (pointer)&local_538;
                local_540 = 0;
                local_538._M_local_buf[0] = '\0';
                local_528._M_p = (pointer)&local_518;
                local_520 = 0;
                local_518._M_local_buf[0] = '\0';
                local_504 = false;
                local_500._M_p = (pointer)&local_4f0;
                local_4f8 = 0;
                local_4f0._M_local_buf[0] = '\0';
                local_4dc = false;
                local_4d8._M_p = (pointer)&local_4c8;
                local_4d0 = 0;
                local_4c8._M_local_buf[0] = '\0';
                local_4b8._M_p = (pointer)&local_4a8;
                local_4b0 = 0;
                local_4a8._M_local_buf[0] = '\0';
                local_498._M_p = (pointer)&local_488;
                local_490 = 0;
                local_488._M_local_buf[0] = '\0';
                local_470._M_color = _S_red;
                local_470._M_parent = (_Base_ptr)0x0;
                local_470._M_left = &local_470;
                local_450 = 0;
                local_447 = false;
                local_445 = false;
                local_443 = false;
                local_441 = false;
                local_43f = false;
                local_43d = false;
                local_43b = false;
                local_439 = false;
                local_437 = false;
                local_435 = false;
                local_240 = false;
                local_570._M_right = local_570._M_left;
                local_470._M_right = local_470._M_left;
                ConfigurePreset::operator=((ConfigurePreset *)local_620,(ConfigurePreset *)pTVar16);
                if (local_240 == true) {
                  local_240 = false;
                  ConfigurePreset::~ConfigurePreset(&local_430);
                }
                psVar18 = &(pTVar16->super_Preset).Name;
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_&,_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
                            *)local_d68,psVar18,
                           (PresetPair<cmCMakePresetsGraph::ConfigurePreset> *)local_620);
                local_ee8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar18;
                pVar20 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                         ::
                         _M_emplace_unique<std::pair<std::__cxx11::string,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>
                                   (local_ef8,
                                    (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
                                     *)local_d68);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
                ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
                         *)local_d68);
                __args = local_f00;
                if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  RVar9 = DUPLICATE_PRESETS;
                  bVar8 = false;
                }
                else if (local_f0c < 3) {
                  if (*(long *)((long)&(pTVar16->Output).
                                       super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                                       ._M_payload + 0x58) == 0) {
                    if (2 < local_f0c) goto LAB_002303a2;
                    if ((pTVar16->super_Preset).ConditionEvaluator.
                        super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr == (element_type *)0x0) {
                      if ((2 < local_f0c) ||
                         (*(long *)&(pTVar16->Output).
                                    super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                                    ._M_payload._M_value.OutputLogFile._M_dataplus == 0))
                      goto LAB_002303a2;
                      RVar9 = TOOLCHAIN_FILE_UNSUPPORTED;
                    }
                    else {
                      RVar9 = CONDITION_UNSUPPORTED;
                    }
                  }
                  else {
                    RVar9 = INSTALL_PREFIX_UNSUPPORTED;
                  }
                  bVar8 = false;
                }
                else {
LAB_002303a2:
                  bVar8 = true;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(local_ec8,(value_type *)local_ee8);
                }
                PresetPair<cmCMakePresetsGraph::ConfigurePreset>::~PresetPair
                          ((PresetPair<cmCMakePresetsGraph::ConfigurePreset> *)local_620);
              }
              if (!bVar8) {
                bVar19 = (byte)local_ee0;
                break;
              }
              pTVar16 = (TestPreset *)
                        ((long)&(pTVar16->Filter).
                                super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                                ._M_payload.
                                super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                                .
                                super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                                ._M_payload._M_value.Include + 0x30);
              bVar19 = pTVar16 == local_f08;
            } while (!(bool)bVar19);
          }
          if ((bVar19 & 1) != 0) {
            local_f08 = local_dd8;
            bVar19 = local_de0 == local_dd8;
            if (!(bool)bVar19) {
              local_ef0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&local_ed8->BuildPresets;
              local_ef8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                           *)&local_ed8->BuildPresetOrder;
              local_ee8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&PTR__BuildPreset_00961618;
              pTVar16 = local_de0;
              do {
                uVar5 = local_c30._8_8_;
                (pTVar16->super_Preset).OriginFile = *__args;
                local_ee0 = (PackagePreset *)CONCAT71(local_ee0._1_7_,bVar19);
                if ((pTVar16->super_Preset).Name._M_string_length == 0) {
                  std::__cxx11::string::append((char *)errMsg);
                  std::__cxx11::string::_M_append
                            ((char *)errMsg,(ulong)(filename->_M_dataplus)._M_p);
                  RVar9 = INVALID_PRESET;
                  bVar8 = false;
                }
                else {
                  local_d68._8_8_ = &local_d50;
                  local_d68._16_8_ = 0;
                  local_d50._0_8_ = local_d50._0_8_ & 0xffffffffffffff00;
                  aStack_d30._M_local_buf[0] = '\0';
                  aStack_d30._1_8_ = 0;
                  local_d40._M_p = (pointer)0x0;
                  uStack_d38 = 0;
                  uStack_d37 = 0;
                  local_d18._M_p = (pointer)&local_d08;
                  local_d10 = (pointer)0x0;
                  local_d08._M_local_buf[0] = false;
                  local_cf8._M_p = (pointer)&local_ce8;
                  local_cf0 = 0;
                  local_ce8._M_local_buf[0] = '\0';
                  local_cd8._M_p = (pointer)0x0;
                  _Stack_cd0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_cc8._M_local_buf[0] = '\x01';
                  local_cb8._M_allocated_capacity._0_4_ = 0;
                  local_cb8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_ca8 = &local_cb8;
                  local_c98 = 0;
                  local_d68._0_8_ = local_ee8;
                  local_c90._0_8_ = local_c80;
                  local_c90._8_8_ = (pointer)0x0;
                  local_c80._0_8_ = local_c80._0_8_ & 0xffffffffffffff00;
                  local_c80[0x11] = false;
                  local_c80._24_8_ = local_c80._24_8_ & 0xffffffffffffff00;
                  auStack_c58._8_8_ = (pointer)0x0;
                  auStack_c60 = (undefined1  [8])0x0;
                  auStack_c58._0_8_ = 0;
                  auStack_c58._16_8_ = local_c38;
                  auStack_c58._24_8_ = 0;
                  local_c38 = (undefined1  [8])((ulong)local_c38 & 0xffffffffffffff00);
                  local_c30[9] = 0;
                  uVar6 = local_c30._8_8_;
                  local_c30._12_4_ = SUB84(uVar5,4);
                  local_c30._8_3_ = (undefined3)uVar6;
                  local_c30[0xb] = 0;
                  aStack_c18._8_8_ = 0;
                  local_c30._16_8_ = (pointer)0x0;
                  aStack_c18._M_allocated_capacity = 0;
                  uStack_c04 = 0;
                  local_b60[200] = '\0';
                  local_ca0 = local_ca8;
                  BuildPreset::operator=((BuildPreset *)local_d68,(BuildPreset *)pTVar16);
                  if (local_b60[200] == '\x01') {
                    local_b60[200] = '\0';
                    BuildPreset::~BuildPreset((BuildPreset *)local_c00);
                  }
                  psVar18 = &(pTVar16->super_Preset).Name;
                  pVar21 = std::
                           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>>>
                           ::
                           _M_emplace_unique<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>&>
                                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>>>>
                                       *)local_ef0->_M_local_buf,psVar18,
                                      (PresetPair<cmCMakePresetsGraph::BuildPreset> *)local_d68);
                  if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                    RVar9 = DUPLICATE_PRESETS;
LAB_002306f8:
                    bVar8 = false;
                  }
                  else {
                    if ((local_f0c < 3) &&
                       ((pTVar16->super_Preset).ConditionEvaluator.
                        super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr != (element_type *)0x0)) {
                      RVar9 = CONDITION_UNSUPPORTED;
                      goto LAB_002306f8;
                    }
                    bVar8 = true;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_ef8,psVar18);
                  }
                  PresetPair<cmCMakePresetsGraph::BuildPreset>::~PresetPair
                            ((PresetPair<cmCMakePresetsGraph::BuildPreset> *)local_d68);
                }
                if (!bVar8) {
                  bVar19 = (byte)local_ee0;
                  break;
                }
                pTVar16 = (TestPreset *)
                          ((long)&(pTVar16->Output).
                                  super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                                  ._M_payload._M_value.OutputLogFile + 0x18);
                bVar19 = pTVar16 == local_f08;
              } while (!(bool)bVar19);
            }
            if ((bVar19 & 1) != 0) {
              local_f08 = local_dc0;
              bVar19 = local_dc8 == local_dc0;
              if (!(bool)bVar19) {
                local_ee8 = &local_ce8;
                local_ef8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                             *)&local_ed8->TestPresets;
                local_ec8 = &local_ed8->TestPresetOrder;
                local_ef0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&PTR__TestPreset_00961668;
                pTVar16 = local_dc8;
                do {
                  local_ee0 = (PackagePreset *)CONCAT71(local_ee0._1_7_,bVar19);
                  (pTVar16->super_Preset).OriginFile = *__args;
                  if ((pTVar16->super_Preset).Name._M_string_length == 0) {
                    RVar9 = INVALID_PRESET;
                    bVar8 = false;
                  }
                  else {
                    local_d68._8_8_ = &local_d50;
                    local_d68._16_8_ = 0;
                    local_d50._0_8_ = local_d50._0_8_ & 0xffffffffffffff00;
                    aStack_d30._M_local_buf[0] = '\0';
                    aStack_d30._1_8_ = 0;
                    local_d40._M_p = (pointer)0x0;
                    uStack_d38 = 0;
                    uStack_d37 = 0;
                    local_d18._M_p = (pointer)&local_d08;
                    local_d10 = (pointer)0x0;
                    local_d08._M_local_buf[0] = false;
                    local_cf8._M_p = (pointer)local_ee8;
                    local_cf0 = 0;
                    local_ce8._M_local_buf[0] = '\0';
                    local_cd8._M_p = (pointer)0x0;
                    _Stack_cd0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_cc8._M_local_buf[0] = '\x01';
                    local_cb8._M_allocated_capacity._0_4_ = 0;
                    local_cb8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_ca8 = &local_cb8;
                    local_c98 = 0;
                    local_d68._0_8_ = local_ef0;
                    local_c90._0_8_ = local_c80;
                    local_c90._8_8_ = (pointer)0x0;
                    local_c80._0_8_ = local_c80._0_8_ & 0xffffffffffffff00;
                    local_c80[0x11] = false;
                    local_c80._24_8_ = auStack_c58;
                    auStack_c60 = (undefined1  [8])0x0;
                    auStack_c58._0_8_ = auStack_c58._0_8_ & 0xffffffffffffff00;
                    local_c38 = (undefined1  [8])0x0;
                    auStack_c58._16_8_ = (pointer)0x0;
                    auStack_c58._24_8_ = 0;
                    local_bb0._M_local_buf[0] = '\0';
                    local_b60[0x110] = 0;
                    local_b60[0x178] = '\0';
                    local_658 = false;
                    local_ca0 = local_ca8;
                    TestPreset::operator=((TestPreset *)local_d68,pTVar16);
                    if (local_658 == true) {
                      local_658 = false;
                      TestPreset::~TestPreset((TestPreset *)(local_b60 + 0x180));
                    }
                    psVar18 = &(pTVar16->super_Preset).Name;
                    pVar22 = std::
                             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>>>
                             ::
                             _M_emplace_unique<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>&>
                                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>>>>
                                         *)local_ef8,psVar18,
                                        (PresetPair<cmCMakePresetsGraph::TestPreset> *)local_d68);
                    if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                    {
                      RVar9 = DUPLICATE_PRESETS;
LAB_00230979:
                      bVar8 = false;
                    }
                    else {
                      if ((local_f0c < 3) &&
                         ((pTVar16->super_Preset).ConditionEvaluator.
                          super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr != (element_type *)0x0)) {
                        RVar9 = CONDITION_UNSUPPORTED;
                        goto LAB_00230979;
                      }
                      if (((local_f0c < 5) &&
                          ((pTVar16->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_engaged == true)) &&
                         (*(char *)((long)&(pTVar16->Output).
                                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                                           ._M_payload + 0x70) != '\0')) {
                        RVar9 = TEST_OUTPUT_TRUNCATION_UNSUPPORTED;
                        goto LAB_00230979;
                      }
                      if (((local_f0c < 6) &&
                          ((pTVar16->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_engaged == true)) &&
                         (*(size_type *)
                           ((long)&(pTVar16->Output).
                                   super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                                   ._M_payload._M_value.OutputJUnitFile + 8) != 0)) {
                        RVar9 = CTEST_JUNIT_UNSUPPORTED;
                        goto LAB_00230979;
                      }
                      bVar8 = true;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(local_ec8,psVar18);
                    }
                    PresetPair<cmCMakePresetsGraph::TestPreset>::~PresetPair
                              ((PresetPair<cmCMakePresetsGraph::TestPreset> *)local_d68);
                  }
                  if (!bVar8) {
                    bVar19 = (byte)local_ee0;
                    break;
                  }
                  pTVar16 = pTVar16 + 1;
                  bVar19 = pTVar16 == local_f08;
                } while (!(bool)bVar19);
              }
              if ((bVar19 & 1) != 0) {
                local_ee0 = local_da8;
                local_f08 = (TestPreset *)CONCAT71(local_f08._1_7_,local_db0 == local_da8);
                if (local_db0 != local_da8) {
                  local_ee8 = &local_cb8;
                  local_ef8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                               *)&local_ed8->PackagePresets;
                  local_ec8 = &local_ed8->PackagePresetOrder;
                  local_ef0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&PTR__PackagePreset_009616b8;
                  pPVar17 = local_db0;
                  do {
                    (pPVar17->super_Preset).OriginFile = *local_f00;
                    if ((pPVar17->super_Preset).Name._M_string_length == 0) {
                      RVar9 = INVALID_PRESET;
                      uVar10 = 0;
                    }
                    else {
                      local_d68._8_8_ = &local_d50;
                      local_d68._16_8_ = 0;
                      local_d50._0_8_ = local_d50._0_8_ & 0xffffffffffffff00;
                      aStack_d30._M_local_buf[0] = '\0';
                      aStack_d30._1_8_ = 0;
                      local_d40._M_p = (pointer)0x0;
                      uStack_d38 = 0;
                      uStack_d37 = 0;
                      local_d18._M_p = (pointer)&local_d08;
                      local_d10 = (pointer)0x0;
                      local_d08._M_local_buf[0] = false;
                      local_cf8._M_p = (pointer)&local_ce8;
                      local_cf0 = 0;
                      local_ce8._M_local_buf[0] = '\0';
                      local_cd8._M_p = (pointer)0x0;
                      _Stack_cd0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      local_cc8._M_local_buf[0] = '\x01';
                      local_cb8._M_allocated_capacity._0_4_ = 0;
                      local_cb8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      local_ca8 = local_ee8;
                      local_ca0 = local_ee8;
                      local_c98 = 0;
                      local_d68._0_8_ = local_ef0;
                      local_c90._0_8_ = local_c80;
                      local_c90._8_8_ = (pointer)0x0;
                      local_c80._0_8_ = local_c80._0_8_ & 0xffffffffffffff00;
                      local_c80[0x11] = false;
                      local_c30._0_4_ = Set;
                      local_c30._8_8_ = (pointer)0x0;
                      auStack_c58._16_8_ = (pointer)0x0;
                      auStack_c58._24_8_ = 0;
                      auStack_c58._0_8_ = 0;
                      auStack_c58._8_8_ = (pointer)0x0;
                      local_c80._24_8_ = (_Base_ptr)0x0;
                      auStack_c60 = (undefined1  [8])0x0;
                      local_c30._16_8_ = local_c30;
                      aStack_c18._8_8_ = 0;
                      _local_c08 = (long)local_c00 + 8;
                      local_c00._0_8_ = (_func_int **)0x0;
                      local_c00[8] = '\0';
                      local_c00[0x19] = '\0';
                      local_c00[0x1b] = '\0';
                      local_c00._32_8_ = local_bd0;
                      local_c00._40_8_ = (pointer)0x0;
                      local_bd0[0]._M_local_buf[0] = '\0';
                      local_bd0[1]._0_8_ = &local_bb0;
                      local_bd0[1]._8_8_ = (File *)0x0;
                      local_bb0._M_local_buf[0] = '\0';
                      local_ba0._M_allocated_capacity = (size_type)&local_b90;
                      local_ba0._8_8_ = 0;
                      local_b90._M_local_buf[0] = '\0';
                      local_b80._M_allocated_capacity = (size_type)&local_b70;
                      local_b80._8_8_ = 0;
                      local_b70._M_local_buf[0] = false;
                      local_b60[0x208] = '\0';
                      aStack_c18._M_allocated_capacity = local_c30._16_8_;
                      PackagePreset::operator=((PackagePreset *)local_d68,pPVar17);
                      if (local_b60[0x208] == '\x01') {
                        local_b60[0x208] = '\0';
                        PackagePreset::~PackagePreset((PackagePreset *)local_b60);
                      }
                      psVar18 = &(pPVar17->super_Preset).Name;
                      pVar23 = std::
                               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>>>
                               ::
                               _M_emplace_unique<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>&>
                                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>>>>
                                           *)local_ef8,psVar18,
                                          (PresetPair<cmCMakePresetsGraph::PackagePreset> *)
                                          local_d68);
                      uVar10 = pVar23._8_4_;
                      RVar12 = DUPLICATE_PRESETS;
                      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back(local_ec8,psVar18);
                        RVar12 = RVar9;
                      }
                      PresetPair<cmCMakePresetsGraph::PackagePreset>::~PresetPair
                                ((PresetPair<cmCMakePresetsGraph::PackagePreset> *)local_d68);
                      RVar9 = RVar12;
                    }
                    if ((uVar10 & 1) == 0) break;
                    pPVar17 = pPVar17 + 1;
                    local_f08 = (TestPreset *)CONCAT71(local_f08._1_7_,pPVar17 == local_ee0);
                  } while (pPVar17 != local_ee0);
                }
                if (((ulong)local_f08 & 1) != 0) {
                  local_ee0 = local_d90;
                  local_f08 = (TestPreset *)CONCAT71(local_f08._1_7_,local_d98 == local_d90);
                  if (local_d98 != local_d90) {
                    local_ef0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&local_ed8->WorkflowPresets;
                    local_ef8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>>>>
                                 *)&local_ed8->WorkflowPresetOrder;
                    local_ee8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&PTR__WorkflowPreset_00961708;
                    pPVar17 = local_d98;
                    do {
                      (pPVar17->super_Preset).OriginFile = *local_f00;
                      if ((pPVar17->super_Preset).Name._M_string_length == 0) {
                        RVar9 = INVALID_PRESET;
                        uVar10 = 0;
                      }
                      else {
                        local_d68._8_8_ = &local_d50;
                        local_d68._16_8_ = 0;
                        local_d50._0_8_ = local_d50._0_8_ & 0xffffffffffffff00;
                        aStack_d30._M_local_buf[0] = '\0';
                        aStack_d30._1_8_ = 0;
                        local_d40._M_p = (pointer)0x0;
                        uStack_d38 = 0;
                        uStack_d37 = 0;
                        local_d18._M_p = (pointer)&local_d08;
                        local_d10 = (pointer)0x0;
                        local_d08._M_local_buf[0] = false;
                        local_cf8._M_p = (pointer)&local_ce8;
                        local_cf0 = 0;
                        local_ce8._M_local_buf[0] = '\0';
                        local_cd8._M_p = (pointer)0x0;
                        _Stack_cd0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        local_cc8._M_local_buf[0] = '\x01';
                        local_cb8._M_allocated_capacity._0_4_ = 0;
                        local_cb8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        local_ca8 = &local_cb8;
                        local_c98 = 0;
                        local_d68._0_8_ = local_ee8;
                        local_c80._0_8_ = (_Base_ptr)0x0;
                        local_c90._0_8_ = (_Base_ptr)0x0;
                        local_c90._8_8_ = (pointer)0x0;
                        local_b90._M_local_buf[8] = '\0';
                        local_ca0 = local_ca8;
                        Preset::operator=((Preset *)local_d68,&pPVar17->super_Preset);
                        std::
                        vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                        ::operator=((vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                                     *)local_c90,
                                    (vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                                     *)&pPVar17->ConfigurePreset);
                        psVar18 = &(pPVar17->super_Preset).Name;
                        std::_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>::_M_reset
                                  ((_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset> *)
                                   (local_c80 + 8));
                        pVar24 = std::
                                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>>>
                                 ::
                                 _M_emplace_unique<std::__cxx11::string&,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>&>
                                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>>>>
                                             *)local_ef0->_M_local_buf,psVar18,
                                            (PresetPair<cmCMakePresetsGraph::WorkflowPreset> *)
                                            local_d68);
                        uVar10 = pVar24._8_4_;
                        RVar12 = DUPLICATE_PRESETS;
                        if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) !=
                            (undefined1  [16])0x0) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_ef8,psVar18);
                          RVar12 = RVar9;
                        }
                        PresetPair<cmCMakePresetsGraph::WorkflowPreset>::~PresetPair
                                  ((PresetPair<cmCMakePresetsGraph::WorkflowPreset> *)local_d68);
                        RVar9 = RVar12;
                      }
                      if ((uVar10 & 1) == 0) break;
                      pPVar17 = (PackagePreset *)
                                ((pPVar17->ConfigurePreset).field_2._M_local_buf + 8);
                      local_f08 = (TestPreset *)CONCAT71(local_f08._1_7_,pPVar17 == local_ee0);
                    } while (pPVar17 != local_ee0);
                  }
                  if (((ulong)local_f08 & 1) != 0) {
                    local_e68._40_8_ = local_ed8;
                    local_e68._48_8_ = local_eb8;
                    local_e68._56_8_ = *local_f00;
                    local_f00 = (File **)CONCAT71(local_f00._1_7_,local_d80 == local_d78);
                    if (local_d80 != local_d78) {
                      pbVar15 = local_d80;
                      do {
                        local_ea8._M_dataplus._M_p = (pointer)&local_ea8.field_2;
                        pcVar3 = (pbVar15->_M_dataplus)._M_p;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_ea8,pcVar3,pcVar3 + pbVar15->_M_string_length);
                        bVar8 = cmsys::SystemTools::FileIsFullPath(&local_ea8);
                        if (!bVar8) {
                          cmsys::SystemTools::GetFilenamePath(&local_e88,filename);
                          local_620._0_8_ = &DAT_00000001;
                          local_d50._M_allocated_capacity = (size_type)(local_620 + 0x10);
                          local_620[0x10] = 0x2f;
                          local_d68._0_8_ = local_e88._M_string_length;
                          local_d68._8_8_ = local_e88._M_dataplus._M_p;
                          local_d68._16_8_ = 1;
                          local_d50._8_8_ = local_ea8._M_string_length;
                          local_d40._M_p = local_ea8._M_dataplus._M_p;
                          views_01._M_len = 3;
                          views_01._M_array = (iterator)local_d68;
                          local_620._8_8_ = local_d50._M_allocated_capacity;
                          cmCatViews_abi_cxx11_((string *)(local_e68 + 0x40),views_01);
                          std::__cxx11::string::operator=
                                    ((string *)&local_ea8,(string *)(local_e68 + 0x40));
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_e68._64_8_ != &local_e18) {
                            operator_delete((void *)local_e68._64_8_,
                                            (ulong)(local_e18._M_allocated_capacity + 1));
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_e88._M_dataplus._M_p != &local_e88.field_2) {
                            operator_delete(local_e88._M_dataplus._M_p,
                                            local_e88.field_2._M_allocated_capacity + 1);
                          }
                        }
                        RVar12 = ReadJSONFile::anon_class_24_3_d2e26b0a::operator()
                                           ((anon_class_24_3_d2e26b0a *)(local_e68 + 0x28),
                                            &local_ea8,local_ebc,Included,errMsg);
                        if (RVar12 != READ_OK) {
                          RVar9 = RVar12;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_ea8._M_dataplus._M_p != &local_ea8.field_2) {
                          operator_delete(local_ea8._M_dataplus._M_p,
                                          local_ea8.field_2._M_allocated_capacity + 1);
                        }
                        if (RVar12 != READ_OK) break;
                        pbVar15 = pbVar15 + 1;
                        local_f00 = (File **)CONCAT71(local_f00._1_7_,pbVar15 == local_d78);
                      } while (pbVar15 != local_d78);
                    }
                    if (((ulong)local_f00 & 1) != 0) {
                      if (local_ebc == User && local_eac == Root) {
                        GetFilename((string *)local_d68,&local_ed8->SourceDir);
                        bVar8 = cmsys::SystemTools::FileExists((string *)local_d68);
                        if ((bVar8) &&
                           (RVar12 = ReadJSONFile::anon_class_24_3_d2e26b0a::operator()
                                               ((anon_class_24_3_d2e26b0a *)(local_e68 + 0x28),
                                                (string *)local_d68,Project,Root,errMsg),
                           RVar12 != READ_OK)) {
                          bVar8 = false;
                          RVar9 = RVar12;
                        }
                        else {
                          bVar8 = true;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d68._0_8_ !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_d68 + 0x10)) {
                          operator_delete((void *)local_d68._0_8_,local_d68._16_8_ + 1);
                        }
                        if (!bVar8) goto LAB_00231183;
                      }
                      psVar18 = &(local_eb8->super_Preset).Name;
                      (psVar18->_M_dataplus)._M_p =
                           (pointer)((long)(psVar18->_M_dataplus)._M_p + -8);
                      RVar9 = READ_OK;
                    }
                  }
                }
              }
            }
          }
LAB_00231183:
          if (local_ed0._M_head_impl != (File *)0x0) {
            std::default_delete<cmCMakePresetsGraph::File>::operator()
                      ((default_delete<cmCMakePresetsGraph::File> *)&local_ed0,
                       local_ed0._M_head_impl);
          }
        }
      }
LAB_0023119a:
      anon_unknown.dwarf_6b2823::RootPresets::~RootPresets((RootPresets *)&local_e08);
    }
  }
  else {
    local_d68._8_8_ = (filename->_M_dataplus)._M_p;
    local_d68._0_8_ = filename->_M_string_length;
    local_d68._16_8_ = 2;
    local_d50._0_8_ =
         (long)"Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n" + 0x41;
    local_d40._M_p = (errMsg->_M_dataplus)._M_p;
    local_d50._8_8_ = errMsg->_M_string_length;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_d68;
    cmCatViews_abi_cxx11_((string *)local_620,views_00);
    std::__cxx11::string::operator=((string *)errMsg,(string *)local_620);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_620._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_620 + 0x10)) {
      operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
    }
    RVar9 = JSON_PARSE_ERROR;
  }
LAB_00230469:
  Json::CharReaderBuilder::~CharReaderBuilder(&local_650);
  Json::Value::~Value((Value *)local_e68);
LAB_00230483:
  std::ifstream::~ifstream(local_238);
  return RVar9;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult cmCMakePresetsGraph::ReadJSONFile(
  const std::string& filename, RootType rootType, ReadReason readReason,
  std::vector<File*>& inProgressFiles, File*& file, std::string& errMsg)
{
  ReadFileResult result;

  for (auto const& f : this->Files) {
    if (cmSystemTools::SameFile(filename, f->Filename)) {
      file = f.get();
      auto fileIt =
        std::find(inProgressFiles.begin(), inProgressFiles.end(), file);
      if (fileIt != inProgressFiles.end()) {
        return cmCMakePresetsGraph::ReadFileResult::CYCLIC_INCLUDE;
      }

      return cmCMakePresetsGraph::ReadFileResult::READ_OK;
    }
  }

  cmsys::ifstream fin(filename.c_str());
  if (!fin) {
    errMsg = cmStrCat(filename, ": Failed to read file\n", errMsg);
    return ReadFileResult::FILE_NOT_FOUND;
  }
  // If there's a BOM, toss it.
  cmsys::FStream::ReadBOM(fin);

  Json::Value root;
  Json::CharReaderBuilder builder;
  Json::CharReaderBuilder::strictMode(&builder.settings_);
  if (!Json::parseFromStream(builder, fin, &root, &errMsg)) {
    errMsg = cmStrCat(filename, ":\n", errMsg);
    return ReadFileResult::JSON_PARSE_ERROR;
  }

  int v = 0;
  if ((result = RootVersionHelper(v, &root)) != ReadFileResult::READ_OK) {
    return result;
  }
  if (v < MIN_VERSION || v > MAX_VERSION) {
    return ReadFileResult::UNRECOGNIZED_VERSION;
  }

  // Support for build and test presets added in version 2.
  if (v < 2 &&
      (root.isMember("buildPresets") || root.isMember("testPresets"))) {
    return ReadFileResult::BUILD_TEST_PRESETS_UNSUPPORTED;
  }

  // Support for package presets added in version 6.
  if (v < 6 && root.isMember("packagePresets")) {
    return ReadFileResult::PACKAGE_PRESETS_UNSUPPORTED;
  }

  // Support for workflow presets added in version 6.
  if (v < 6 && root.isMember("workflowPresets")) {
    return ReadFileResult::WORKFLOW_PRESETS_UNSUPPORTED;
  }

  // Support for include added in version 4.
  if (v < 4 && root.isMember("include")) {
    return ReadFileResult::INCLUDE_UNSUPPORTED;
  }

  RootPresets presets;
  if ((result = RootPresetsHelper(presets, &root)) !=
      ReadFileResult::READ_OK) {
    return result;
  }

  unsigned int currentMajor = cmVersion::GetMajorVersion();
  unsigned int currentMinor = cmVersion::GetMinorVersion();
  unsigned int currentPatch = cmVersion::GetPatchVersion();
  auto const& required = presets.CMakeMinimumRequired;
  if (required.Major > currentMajor ||
      (required.Major == currentMajor &&
       (required.Minor > currentMinor ||
        (required.Minor == currentMinor &&
         (required.Patch > currentPatch))))) {
    return ReadFileResult::UNRECOGNIZED_CMAKE_VERSION;
  }

  auto filePtr = cm::make_unique<File>();
  file = filePtr.get();
  this->Files.emplace_back(std::move(filePtr));
  inProgressFiles.emplace_back(file);
  file->Filename = filename;
  file->Version = v;
  file->ReachableFiles.insert(file);

  for (auto& preset : presets.ConfigurePresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      errMsg += R"(\n\t)";
      errMsg += filename;
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<ConfigurePreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->ConfigurePresets
           .emplace(std::make_pair(preset.Name, presetPair))
           .second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for installDir presets added in version 3.
    if (v < 3 && !preset.InstallDir.empty()) {
      return ReadFileResult::INSTALL_PREFIX_UNSUPPORTED;
    }

    // Support for conditions added in version 3.
    if (v < 3 && preset.ConditionEvaluator) {
      return ReadFileResult::CONDITION_UNSUPPORTED;
    }

    // Support for toolchainFile presets added in version 3.
    if (v < 3 && !preset.ToolchainFile.empty()) {
      return ReadFileResult::TOOLCHAIN_FILE_UNSUPPORTED;
    }

    this->ConfigurePresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.BuildPresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      errMsg += R"(\n\t)";
      errMsg += filename;
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<BuildPreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->BuildPresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3.
    if (v < 3 && preset.ConditionEvaluator) {
      return ReadFileResult::CONDITION_UNSUPPORTED;
    }

    this->BuildPresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.TestPresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<TestPreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->TestPresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3.
    if (v < 3 && preset.ConditionEvaluator) {
      return ReadFileResult::CONDITION_UNSUPPORTED;
    }

    // Support for TestOutputTruncation added in version 5.
    if (v < 5 && preset.Output && preset.Output->TestOutputTruncation) {
      return ReadFileResult::TEST_OUTPUT_TRUNCATION_UNSUPPORTED;
    }

    // Support for outputJUnitFile added in version 6.
    if (v < 6 && preset.Output && !preset.Output->OutputJUnitFile.empty()) {
      return ReadFileResult::CTEST_JUNIT_UNSUPPORTED;
    }

    this->TestPresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.PackagePresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<PackagePreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->PackagePresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3, but this requires version 5
    // already, so no action needed.

    this->PackagePresetOrder.push_back(preset.Name);
  }

  for (auto& preset : presets.WorkflowPresets) {
    preset.OriginFile = file;
    if (preset.Name.empty()) {
      return ReadFileResult::INVALID_PRESET;
    }

    PresetPair<WorkflowPreset> presetPair;
    presetPair.Unexpanded = preset;
    presetPair.Expanded = cm::nullopt;
    if (!this->WorkflowPresets.emplace(preset.Name, presetPair).second) {
      return ReadFileResult::DUPLICATE_PRESETS;
    }

    // Support for conditions added in version 3, but this requires version 6
    // already, so no action needed.

    this->WorkflowPresetOrder.push_back(preset.Name);
  }

  auto const includeFile = [this, &inProgressFiles, file](
                             const std::string& include, RootType rootType2,
                             ReadReason readReason2,
                             std::string& FailureMessage) -> ReadFileResult {
    ReadFileResult r;
    File* includedFile;
    if ((r = this->ReadJSONFile(include, rootType2, readReason2,
                                inProgressFiles, includedFile,
                                FailureMessage)) != ReadFileResult::READ_OK) {
      return r;
    }

    file->ReachableFiles.insert(includedFile->ReachableFiles.begin(),
                                includedFile->ReachableFiles.end());
    return ReadFileResult::READ_OK;
  };

  for (auto include : presets.Include) {
    if (!cmSystemTools::FileIsFullPath(include)) {
      auto directory = cmSystemTools::GetFilenamePath(filename);
      include = cmStrCat(directory, '/', include);
    }

    if ((result = includeFile(include, rootType, ReadReason::Included,
                              errMsg)) != ReadFileResult::READ_OK) {
      return result;
    }
  }

  if (rootType == RootType::User && readReason == ReadReason::Root) {
    auto cmakePresetsFilename = GetFilename(this->SourceDir);
    if (cmSystemTools::FileExists(cmakePresetsFilename)) {
      if ((result = includeFile(cmakePresetsFilename, RootType::Project,
                                ReadReason::Root, errMsg)) !=
          ReadFileResult::READ_OK) {
        return result;
      }
    }
  }

  inProgressFiles.pop_back();
  return ReadFileResult::READ_OK;
}